

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocatedInternal<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,string *value)

{
  Rep *pRVar1;
  Arena *value_arena;
  Arena *my_arena;
  void **elems;
  Arena *arena;
  Arena *element_arena;
  Type *value_local;
  RepeatedPtrFieldBase *this_local;
  
  value_arena = StringTypeHandler::GetOwningArena(value);
  my_arena = GetArena(this);
  if (((my_arena == value_arena) && (this->rep_ != (Rep *)0x0)) &&
     (this->rep_->allocated_size < this->total_size_)) {
    pRVar1 = this->rep_;
    if (this->current_size_ < this->rep_->allocated_size) {
      pRVar1->elements[this->rep_->allocated_size] = pRVar1->elements[this->current_size_];
    }
    pRVar1->elements[this->current_size_] = value;
    this->current_size_ = this->current_size_ + 1;
    this->rep_->allocated_size = this->rep_->allocated_size + 1;
  }
  else {
    AddAllocatedSlowWithCopy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (this,value,value_arena,my_arena);
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::AddAllocatedInternal(
    typename TypeHandler::Type* value, std::true_type) {
  Arena* element_arena =
      reinterpret_cast<Arena*>(TypeHandler::GetOwningArena(value));
  Arena* arena = GetArena();
  if (arena == element_arena && rep_ && rep_->allocated_size < total_size_) {
    // Fast path: underlying arena representation (tagged pointer) is equal to
    // our arena pointer, and we can add to array without resizing it (at least
    // one slot that is not allocated).
    void** elems = rep_->elements;
    if (current_size_ < rep_->allocated_size) {
      // Make space at [current] by moving first allocated element to end of
      // allocated list.
      elems[rep_->allocated_size] = elems[current_size_];
    }
    elems[current_size_] = value;
    current_size_ = current_size_ + 1;
    rep_->allocated_size = rep_->allocated_size + 1;
  } else {
    AddAllocatedSlowWithCopy<TypeHandler>(value, element_arena, arena);
  }
}